

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

bool __thiscall
duckdb::CatalogSet::DropEntryInternal
          (CatalogSet *this,CatalogTransaction transaction,string *name,bool allow_drop_internal)

{
  CatalogTransaction transaction_00;
  bool bVar1;
  CatalogEntry *pCVar2;
  undefined8 uVar3;
  DuckTransactionManager *this_00;
  pointer transaction_p;
  AttachedDatabase *db;
  byte in_DL;
  CatalogSet *in_RDI;
  pointer value_ptr;
  templated_unique_single_t value;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  Catalog *in_stack_fffffffffffffeb0;
  undefined1 *extra_data_size;
  CatalogType *in_stack_fffffffffffffeb8;
  CatalogEntryMap *extra_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  CatalogException *in_stack_fffffffffffffed0;
  string *in_stack_ffffffffffffff30;
  optional_ptr<duckdb::CatalogSet,_true> in_stack_ffffffffffffff38;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 in_stack_ffffffffffffff58 [32];
  allocator local_71;
  string local_70 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>_> *puStack_48;
  __int_type local_40;
  __node_base _Stack_38;
  CatalogEntry *local_28;
  byte local_19;
  byte local_1;
  
  local_19 = in_DL & 1;
  memcpy(&local_50,&stack0x00000008,0x28);
  transaction_00.db.ptr._7_1_ = in_stack_ffffffffffffff57;
  transaction_00.db.ptr._0_7_ = in_stack_ffffffffffffff50;
  transaction_00.context.ptr = (ClientContext *)in_stack_ffffffffffffff58._0_8_;
  transaction_00.transaction.ptr = (Transaction *)in_stack_ffffffffffffff58._8_8_;
  transaction_00.transaction_id = in_stack_ffffffffffffff58._16_8_;
  transaction_00.start_time = in_stack_ffffffffffffff58._24_8_;
  local_28 = (CatalogEntry *)
             GetEntryInternal(in_stack_ffffffffffffff38.ptr,transaction_00,in_stack_ffffffffffffff30
                             );
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_28);
  if (bVar1) {
    pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)puStack_48);
    if (((pCVar2->internal & 1U) != 0) && ((local_19 & 1) == 0)) {
      uVar3 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_70,"Cannot drop entry \"%s\" because it is an internal system entry",
                 &local_71);
      pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                         ((optional_ptr<duckdb::CatalogEntry,_true> *)puStack_48);
      ::std::__cxx11::string::string((string *)&stack0xffffffffffffff58,(string *)&pCVar2->name);
      CatalogException::CatalogException<std::__cxx11::string>
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      __cxa_throw(uVar3,&CatalogException::typeinfo,CatalogException::~CatalogException);
    }
    pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)puStack_48);
    (*pCVar2->_vptr_CatalogEntry[6])();
    pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)puStack_48);
    (*pCVar2->_vptr_CatalogEntry[0xb])();
    optional_ptr<duckdb::CatalogEntry,_true>::operator->
              ((optional_ptr<duckdb::CatalogEntry,_true> *)puStack_48);
    make_uniq<duckdb::InCatalogEntry,duckdb::CatalogType,duckdb::Catalog&,std::__cxx11::string&>
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
    operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                *)puStack_48);
    ::std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)_Stack_38._M_nxt,local_40);
    optional_ptr<duckdb::CatalogSet,_true>::optional_ptr
              ((optional_ptr<duckdb::CatalogSet,_true> *)&stack0xffffffffffffff38,in_RDI);
    this_00 = (DuckTransactionManager *)
              unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
              ::operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                            *)puStack_48);
    ((optional_ptr<duckdb::CatalogSet,_true> *)&this_00->current_transaction_id)->ptr =
         in_stack_ffffffffffffff38.ptr;
    transaction_p =
         unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
         operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                     *)puStack_48);
    (transaction_p->super_CatalogEntry).deleted = true;
    extra_data_size = &stack0xffffffffffffff48;
    ::std::unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>_>::get
              (puStack_48);
    extra_data = &in_RDI->map;
    pCVar2 = (CatalogEntry *)&stack0xffffffffffffff28;
    unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>::
    unique_ptr<duckdb::InCatalogEntry,std::default_delete<std::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>>>,void>
              ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               puStack_48,
               (unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>_> *)
               local_50._M_pi);
    CatalogEntryMap::UpdateEntry
              ((CatalogEntryMap *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::~unique_ptr
              ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               0x2a788b);
    bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&stack0x00000018);
    if (bVar1) {
      db = (AttachedDatabase *)GetCatalog(in_RDI);
      Catalog::GetAttached((Catalog *)db);
      DuckTransactionManager::Get(db);
      optional_ptr<duckdb::Transaction,_true>::operator*
                ((optional_ptr<duckdb::Transaction,_true> *)puStack_48);
      CatalogEntry::Child((CatalogEntry *)0x2a7901);
      DuckTransactionManager::PushCatalogEntry
                (this_00,(Transaction *)transaction_p,pCVar2,(data_ptr_t)extra_data,
                 (idx_t)extra_data_size);
    }
    local_1 = 1;
    unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
    ~unique_ptr((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                 *)0x2a7976);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool CatalogSet::DropEntryInternal(CatalogTransaction transaction, const string &name, bool allow_drop_internal) {
	// lock the catalog for writing
	// we can only delete an entry that exists
	auto entry = GetEntryInternal(transaction, name);
	if (!entry) {
		return false;
	}
	if (entry->internal && !allow_drop_internal) {
		throw CatalogException("Cannot drop entry \"%s\" because it is an internal system entry", entry->name);
	}

	entry->OnDrop();

	// create a new tombstone entry and replace the currently stored one
	// set the timestamp to the timestamp of the current transaction
	// and point it at the tombstone node
	auto value = make_uniq<InCatalogEntry>(CatalogType::DELETED_ENTRY, entry->ParentCatalog(), entry->name);
	value->timestamp = transaction.transaction_id;
	value->set = this;
	value->deleted = true;
	auto value_ptr = value.get();
	map.UpdateEntry(std::move(value));

	// push the old entry in the undo buffer for this transaction
	if (transaction.transaction) {
		DuckTransactionManager::Get(GetCatalog().GetAttached())
		    .PushCatalogEntry(*transaction.transaction, value_ptr->Child());
	}
	return true;
}